

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O0

MPP_RET vdpp2_done(vdpp2_api_ctx *ctx)

{
  vdpp2_reg *reg;
  vdpp2_api_ctx *ctx_local;
  
  if (ctx == (vdpp2_api_ctx *)0x0) {
    _mpp_log_l(2,"vdpp2","found NULL input vdpp ctx %p\n","vdpp2_done",0);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","ro_frm_done_sts=%d\n",0,*(byte *)&(ctx->reg).common.reg10 & 1);
    }
    if ((vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","ro_osd_max_sts=%d\n",0,*(byte *)&(ctx->reg).common.reg10 >> 1 & 1);
    }
    if ((vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","ro_bus_error_sts=%d\n",0,*(byte *)&(ctx->reg).common.reg10 >> 4 & 1);
    }
    if ((vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","ro_timeout_sts=%d\n",0,*(byte *)&(ctx->reg).common.reg10 >> 5 & 1);
    }
    if ((vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","ro_config_error_sts=%d\n",0,*(byte *)&(ctx->reg).common.reg10 >> 5 & 1);
    }
    if ((((uint)(ctx->reg).common.reg8 & 1) == 0) || (((uint)(ctx->reg).common.reg10 & 1) != 0)) {
      if ((vdpp2_debug & 2) != 0) {
        _mpp_log_l(4,"vdpp2","run vdpp success\n",0);
      }
      ctx_local._4_4_ = MPP_OK;
    }
    else {
      _mpp_log_l(2,"vdpp2","run vdpp failed\n","vdpp2_done");
      ctx_local._4_4_ = MPP_NOK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET vdpp2_done(struct vdpp2_api_ctx *ctx)
{
    struct vdpp2_reg *reg = &ctx->reg;

    if (NULL == ctx) {
        mpp_err_f("found NULL input vdpp ctx %p\n", ctx);
        return MPP_ERR_NULL_PTR;
    }

    reg = &ctx->reg;

    VDPP2_DBG(VDPP2_DBG_INT, "ro_frm_done_sts=%d\n", reg->common.reg10.ro_frm_done_sts);
    VDPP2_DBG(VDPP2_DBG_INT, "ro_osd_max_sts=%d\n", reg->common.reg10.ro_osd_max_sts);
    VDPP2_DBG(VDPP2_DBG_INT, "ro_bus_error_sts=%d\n", reg->common.reg10.ro_bus_error_sts);
    VDPP2_DBG(VDPP2_DBG_INT, "ro_timeout_sts=%d\n", reg->common.reg10.ro_timeout_sts);
    VDPP2_DBG(VDPP2_DBG_INT, "ro_config_error_sts=%d\n", reg->common.reg10.ro_timeout_sts);

    if (reg->common.reg8.sw_vdpp_frm_done_en &&
        !reg->common.reg10.ro_frm_done_sts) {
        mpp_err_f("run vdpp failed\n");
        return MPP_NOK;
    }

    VDPP2_DBG(VDPP2_DBG_INT, "run vdpp success\n");

    return MPP_OK;
}